

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateShader
          (RenderDeviceGLImpl *this,ShaderCreateInfo *ShaderCreateInfo,IShader **ppShader,
          IDataBlob **ppCompilerOutput,bool bIsDeviceInternal)

{
  CreateInfo GLShaderCI;
  bool local_19;
  CreateInfo local_18;
  
  local_18.DeviceInfo = &(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo;
  local_18.AdapterInfo = &(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo
  ;
  local_19 = bIsDeviceInternal;
  local_18.ppCompilerOutput = ppCompilerOutput;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateShaderImpl<Diligent::ShaderGLImpl::CreateInfo,bool>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppShader,ShaderCreateInfo,
             &local_18,&local_19);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateShader(const ShaderCreateInfo& ShaderCreateInfo,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput,
                                      bool                    bIsDeviceInternal)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        GetDeviceInfo(),
        GetAdapterInfo(),
        ppCompilerOutput,
    };
    CreateShaderImpl(ppShader, ShaderCreateInfo, GLShaderCI, bIsDeviceInternal);
}